

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Dimension>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  int iVar2;
  Rep *pRVar3;
  LogMessage *other;
  long lVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  iVar2 = this->current_size_;
  if ((long)iVar2 < 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x606);
    other = LogMessage::operator<<(&local_58,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  if (0 < iVar2) {
    pRVar3 = this->rep_;
    lVar4 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar4;
      lVar4 = lVar4 + 1;
      CoreML::Specification::MILSpec::Dimension::clear_dimension((Dimension *)*ppvVar1);
    } while (iVar2 != lVar4);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}